

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O3

void __thiscall
mjs::gc_vector<const_mjs::function_definition_*>::ensure_capacity
          (gc_vector<const_mjs::function_definition_*> *this)

{
  gc_table *pgVar1;
  gc_table local_20;
  
  pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<const_mjs::function_definition_*>::gc_table,_true>::
           dereference(&this->table_,this->heap_);
  if (pgVar1->length_ == pgVar1->capacity_) {
    gc_table::copy_with_increased_capacity(&local_20,(uint32_t)pgVar1);
    (this->table_).pos_ = local_20.capacity_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_20);
  }
  return;
}

Assistant:

void ensure_capacity() {
        auto& t = tab();
        if (t.length() == t.capacity()) {
            table_ = t.copy_with_increased_capacity(2 * t.capacity());
        }
    }